

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

size_t atohex(uchar *b,size_t bsize,char *p,size_t psize)

{
  size_t sVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  
  if (p < (char *)0x2) {
    return 0;
  }
  sVar5 = 0;
  pcVar6 = p + -2;
  do {
    cVar2 = *(char *)(bsize + sVar5 * 2);
    if (((byte)(cVar2 + 0x9fU) < 6) || ((byte)(cVar2 + 0xbfU) < 6)) {
      bVar4 = cVar2 * '\x10' + 0x90;
    }
    else {
      if (9 < (byte)(cVar2 - 0x30U)) {
        return 0xffffffffffffffff;
      }
      bVar4 = cVar2 << 4;
    }
    cVar2 = *(char *)(bsize + 1 + sVar5 * 2);
    if ((byte)(cVar2 + 0x9fU) < 6) {
      bVar7 = cVar2 + 0xa9;
    }
    else if ((byte)(cVar2 + 0xbfU) < 6) {
      bVar7 = cVar2 - 0x37;
    }
    else {
      bVar7 = cVar2 - 0x30;
      if (9 < bVar7) {
        return 0xffffffffffffffff;
      }
    }
    b[sVar5] = bVar7 | bVar4;
    sVar1 = sVar5 + 1;
  } while ((sVar5 != 0x13) &&
          (bVar3 = (char *)0x1 < pcVar6, sVar5 = sVar1, pcVar6 = pcVar6 + -2, bVar3));
  return sVar1;
}

Assistant:

static size_t
atohex(unsigned char *b, size_t bsize, const char *p, size_t psize)
{
	size_t fbsize = bsize;

	while (bsize && psize > 1) {
		unsigned char x;

		if (p[0] >= 'a' && p[0] <= 'f')
			x = (p[0] - 'a' + 0x0a) << 4;
		else if (p[0] >= 'A' && p[0] <= 'F')
			x = (p[0] - 'A' + 0x0a) << 4;
		else if (p[0] >= '0' && p[0] <= '9')
			x = (p[0] - '0') << 4;
		else
			return (-1);
		if (p[1] >= 'a' && p[1] <= 'f')
			x |= p[1] - 'a' + 0x0a;
		else if (p[1] >= 'A' && p[1] <= 'F')
			x |= p[1] - 'A' + 0x0a;
		else if (p[1] >= '0' && p[1] <= '9')
			x |= p[1] - '0';
		else
			return (-1);

		*b++ = x;
		bsize--;
		p += 2;
		psize -= 2;
	}
	return (fbsize - bsize);
}